

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

property_ptr __thiscall
dtc::fdt::device_tree::assign_phandle(device_tree *this,node_ptr *n,uint32_t *phandle)

{
  uint uVar1;
  string *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar3;
  long lVar4;
  __buckets_ptr pp_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  __node_base_ptr p_Var7;
  property *ppVar8;
  pointer puVar9;
  key_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  int bit;
  int iVar11;
  ulong uVar12;
  size_t sVar13;
  property_ptr pVar14;
  property_value v;
  string local_1c8;
  long *local_1a8;
  long local_1a0;
  long local_198 [2];
  undefined1 *local_188;
  long local_180;
  undefined1 local_178;
  undefined7 uStack_177;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  value_type local_150;
  undefined1 local_148 [32];
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  pointer local_108;
  pointer puStack_100;
  pointer local_f8;
  value_type local_f0;
  undefined1 local_e8 [32];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  pointer local_a8;
  pointer puStack_a0;
  pointer local_98;
  value_type local_90;
  __buckets_ptr local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  __node_base local_78;
  size_type sStack_70;
  float local_68;
  undefined4 uStack_64;
  size_t sStack_60;
  __node_base_ptr local_58;
  _Alloc_hider local_50;
  size_type local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  
  psVar2 = *(string **)phandle;
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"phandle","");
  pVar14 = node::get_property((node *)this,psVar2);
  _Var10 = pVar14.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (local_1a8 != local_198) {
    operator_delete(local_1a8,local_198[0] + 1);
    _Var10._M_pi = extraout_RDX;
  }
  lVar4._0_4_ = this->phandle_node_name;
  lVar4._4_1_ = this->valid;
  lVar4._5_1_ = this->garbage_collect;
  lVar4._6_2_ = *(undefined2 *)&this->field_0x6;
  if (lVar4 == 0) {
    psVar2 = *(string **)phandle;
    local_1a8 = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"linux,phandle","");
    pVar14 = node::get_property((node *)&stack0xffffffffffffff78,psVar2);
    p_Var6 = p_Stack_80;
    pp_Var5 = local_88;
    _Var10 = pVar14.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    local_88 = (__buckets_ptr)0x0;
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              (this->reservations).
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(__buckets_ptr *)this = pp_Var5;
    (this->reservations).
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var6;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var10._M_pi = extraout_RDX_00;
    }
    if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
      _Var10._M_pi = extraout_RDX_01;
    }
    if (local_1a8 != local_198) {
      operator_delete(local_1a8,local_198[0] + 1);
      _Var10._M_pi = extraout_RDX_02;
    }
  }
  lVar3._0_4_ = this->phandle_node_name;
  lVar3._4_1_ = this->valid;
  lVar3._5_1_ = this->garbage_collect;
  lVar3._6_2_ = *(undefined2 *)&this->field_0x6;
  if (lVar3 == 0) {
    local_48 = 0;
    local_40 = '\0';
    local_1a8 = local_198;
    local_50._M_p = &stack0xffffffffffffffc0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,&stack0xffffffffffffffc0,&stack0xffffffffffffffc0);
    local_188 = &local_178;
    local_180 = 0;
    local_178 = 0;
    local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_150 = UNKNOWN;
    if (local_50._M_p != &stack0xffffffffffffffc0) {
      operator_delete(local_50._M_p,CONCAT71(uStack_3f,local_40) + 1);
    }
    while( true ) {
      p_Var7 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         ((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<dtc::fdt::node>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)(n + 0x1a),
                          (ulong)*in_RCX %
                          (ulong)n[0x1a].
                                 super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,in_RCX,(ulong)*in_RCX);
      if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) break;
      *in_RCX = *in_RCX + 1;
    }
    uVar1 = *in_RCX;
    *in_RCX = uVar1 + 1;
    iVar11 = 0x18;
    do {
      local_88 = (__buckets_ptr)CONCAT71(local_88._1_7_,(char)(uVar1 >> ((byte)iVar11 & 0x1f)));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&local_168,(uchar *)&stack0xffffffffffffff78);
      iVar11 = iVar11 + -8;
    } while (iVar11 != -8);
    _Var10._M_pi = extraout_RDX_03;
    if (((ulong)(n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr &
        0xfffffffd) == 0) {
      ppVar8 = (property *)operator_new(0x78);
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"linux,phandle","");
      local_88 = &stack0xffffffffffffffa8;
      local_78._M_nxt = (_Hash_node_base *)0x0;
      sStack_70 = 0;
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
      local_68 = 1.0;
      uStack_64 = 0;
      sStack_60 = 0;
      local_58 = (__node_base_ptr)0x0;
      property::property(ppVar8,&local_1c8,(string_set *)&stack0xffffffffffffff78);
      std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::reset<dtc::fdt::property>
                ((__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *)this,ppVar8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&stack0xffffffffffffff78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      lVar4 = *(long *)this;
      local_148._0_8_ = local_148 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_148,local_1a8,local_1a0 + (long)local_1a8);
      local_128._M_p = (pointer)&local_118;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_188,local_188 + local_180);
      local_108 = (pointer)0x0;
      puStack_100 = (pointer)0x0;
      local_f8 = (pointer)0x0;
      uVar12 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (uVar12 == 0) {
        puVar9 = (pointer)0x0;
      }
      else {
        if ((long)uVar12 < 0) {
          std::__throw_bad_alloc();
        }
        puVar9 = (pointer)operator_new(uVar12);
      }
      local_f8 = puVar9 + uVar12;
      sVar13 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      local_108 = puVar9;
      if (sVar13 != 0) {
        puStack_100 = puVar9;
        memmove(puVar9,local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,sVar13);
      }
      puStack_100 = puVar9 + sVar13;
      local_f0 = local_150;
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                ((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
                 (lVar4 + 0x58),(value_type *)local_148);
      if (local_108 != (pointer)0x0) {
        operator_delete(local_108,(long)local_f8 - (long)local_108);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_p != &local_118) {
        operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      std::
      vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
      ::push_back((vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
                   *)(*(long *)phandle + 0x88),(value_type *)this);
      _Var10._M_pi = extraout_RDX_04;
    }
    if (*(int *)&(n->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr - 1U < 2
       ) {
      ppVar8 = (property *)operator_new(0x78);
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"phandle","");
      local_88 = &stack0xffffffffffffffa8;
      local_78._M_nxt = (_Hash_node_base *)0x0;
      sStack_70 = 0;
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
      local_68 = 1.0;
      uStack_64 = 0;
      sStack_60 = 0;
      local_58 = (__node_base_ptr)0x0;
      property::property(ppVar8,&local_1c8,(string_set *)&stack0xffffffffffffff78);
      std::__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>::reset<dtc::fdt::property>
                ((__shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2> *)this,ppVar8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&stack0xffffffffffffff78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      lVar4 = *(long *)this;
      local_e8._0_8_ = local_e8 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e8,local_1a8,local_1a0 + (long)local_1a8);
      local_c8._M_p = (pointer)&local_b8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_188,local_188 + local_180)
      ;
      local_a8 = (pointer)0x0;
      puStack_a0 = (pointer)0x0;
      local_98 = (pointer)0x0;
      uVar12 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (uVar12 == 0) {
        puVar9 = (pointer)0x0;
      }
      else {
        if ((long)uVar12 < 0) {
          std::__throw_bad_alloc();
        }
        puVar9 = (pointer)operator_new(uVar12);
      }
      local_98 = puVar9 + uVar12;
      sVar13 = (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      local_a8 = puVar9;
      if (sVar13 != 0) {
        puStack_a0 = puVar9;
        memmove(puVar9,local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,sVar13);
      }
      puStack_a0 = puVar9 + sVar13;
      local_90 = local_150;
      std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                ((vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_> *)
                 (lVar4 + 0x58),(value_type *)local_e8);
      if (local_a8 != (pointer)0x0) {
        operator_delete(local_a8,(long)local_98 - (long)local_a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_p != &local_b8) {
        operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
      }
      std::
      vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
      ::push_back((vector<std::shared_ptr<dtc::fdt::property>,_std::allocator<std::shared_ptr<dtc::fdt::property>_>_>
                   *)(*(long *)phandle + 0x88),(value_type *)this);
      _Var10._M_pi = extraout_RDX_05;
    }
    if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_168.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      _Var10._M_pi = extraout_RDX_06;
    }
    if (local_188 != &local_178) {
      operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
      _Var10._M_pi = extraout_RDX_07;
    }
    if (local_1a8 != local_198) {
      operator_delete(local_1a8,local_198[0] + 1);
      _Var10._M_pi = extraout_RDX_08;
    }
  }
  pVar14.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var10._M_pi;
  pVar14.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (property_ptr)pVar14.super___shared_ptr<dtc::fdt::property,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

property_ptr
device_tree::assign_phandle(node_ptr n, uint32_t &phandle)
{
	// If there is an existing phandle, use it
	property_ptr p = n->get_property("phandle");
	if (p == 0)
	{
		p = n->get_property("linux,phandle");
	}
	if (p == 0)
	{
		// Otherwise insert a new phandle node
		property_value v;
		while (used_phandles.find(phandle) != used_phandles.end())
		{
			// Note that we only don't need to
			// store this phandle in the set,
			// because we are monotonically
			// increasing the value of phandle and
			// so will only ever revisit this value
			// if we have used 2^32 phandles, at
			// which point our blob won't fit in
			// any 32-bit system and we've done
			// something badly wrong elsewhere
			// already.
			phandle++;
		}
		push_big_endian(v.byte_data, phandle++);
		if (phandle_node_name == BOTH || phandle_node_name == LINUX)
		{
			p.reset(new property("linux,phandle"));
			p->add_value(v);
			n->add_property(p);
		}
		if (phandle_node_name == BOTH || phandle_node_name == EPAPR)
		{
			p.reset(new property("phandle"));
			p->add_value(v);
			n->add_property(p);
		}
	}

	return (p);
}